

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
llvm::
DenseMapIterator<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
::DenseMapIterator(DenseMapIterator<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                   *this,pointer Pos,pointer E,DebugEpochBase *Epoch,bool NoAdvance)

{
  bool bVar1;
  bool NoAdvance_local;
  DebugEpochBase *Epoch_local;
  pointer E_local;
  pointer Pos_local;
  DenseMapIterator<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
  *this_local;
  
  DebugEpochBase::HandleBase::HandleBase((HandleBase *)this,Epoch);
  this->Ptr = Pos;
  this->End = E;
  bVar1 = DebugEpochBase::HandleBase::isHandleInSync((HandleBase *)this);
  if (bVar1) {
    if (!NoAdvance) {
      bVar1 = shouldReverseIterate<unsigned_long>();
      if (bVar1) {
        RetreatPastEmptyBuckets(this);
      }
      else {
        AdvancePastEmptyBuckets(this);
      }
    }
    return;
  }
  __assert_fail("isHandleInSync() && \"invalid construction!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                ,0x46c,
                "llvm::DenseMapIterator<unsigned long, std::vector<unsigned char>>::DenseMapIterator(pointer, pointer, const DebugEpochBase &, bool) [KeyT = unsigned long, ValueT = std::vector<unsigned char>, KeyInfoT = llvm::DenseMapInfo<unsigned long>, Bucket = llvm::detail::DenseMapPair<unsigned long, std::vector<unsigned char>>, IsConst = false]"
               );
}

Assistant:

DenseMapIterator(pointer Pos, pointer E, const DebugEpochBase &Epoch,
                   bool NoAdvance = false)
      : DebugEpochBase::HandleBase(&Epoch), Ptr(Pos), End(E) {
    assert(isHandleInSync() && "invalid construction!");

    if (NoAdvance) return;
    if (shouldReverseIterate<KeyT>()) {
      RetreatPastEmptyBuckets();
      return;
    }
    AdvancePastEmptyBuckets();
  }